

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splines.h
# Opt level: O0

Point3<float>
pbrt::EvaluateCubicBezier<pbrt::Point3<float>,pbrt::Vector3<float>>
          (span<const_pbrt::Point3<float>_> cp,Float u,Vector3<float> *deriv)

{
  undefined8 uVar1;
  Tuple3<pbrt::Point3,_float> TVar2;
  Point3<float> *this;
  undefined8 *in_RDX;
  int in_XMM0_Da;
  float fVar3;
  undefined1 auVar14 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 extraout_var [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  Point3<float> PVar15;
  Vector3<float> VVar16;
  Point3<float> cp2 [2];
  Point3<float> cp1 [3];
  undefined4 in_stack_fffffffffffffe48;
  Tuple3<pbrt::Vector3,_float> *t;
  Tuple3<pbrt::Point3,_float> *in_stack_fffffffffffffe90;
  Tuple3<pbrt::Point3,_float> *t1;
  Tuple3<pbrt::Point3,_float> *in_stack_fffffffffffffe98;
  Tuple3<pbrt::Point3,_float> *t0;
  Float in_stack_fffffffffffffea4;
  Tuple3<pbrt::Vector3,_float> local_d4;
  undefined8 local_c8;
  float local_c0;
  undefined8 local_b8;
  float local_b0;
  undefined8 local_a8;
  float local_a0;
  undefined8 local_9c;
  float local_94;
  Tuple3<pbrt::Point3,_float> local_88;
  Tuple3<pbrt::Point3,_float> local_78;
  undefined8 local_68;
  float local_60;
  undefined8 local_58;
  float local_50;
  Tuple3<pbrt::Point3,_float> local_4c;
  Tuple3<pbrt::Point3,_float> local_40;
  undefined8 *local_30;
  int local_24;
  span<const_pbrt::Point3<float>_> local_20 [2];
  
  local_30 = in_RDX;
  local_24 = in_XMM0_Da;
  this = pstd::span<const_pbrt::Point3<float>_>::operator[](local_20,0);
  t = (Tuple3<pbrt::Vector3,_float> *)0x1;
  pstd::span<const_pbrt::Point3<float>_>::operator[](local_20,1);
  auVar14 = (undefined1  [56])0x0;
  PVar15 = Lerp<pbrt::Point3,float>
                     (in_stack_fffffffffffffea4,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90)
  ;
  local_60 = PVar15.super_Tuple3<pbrt::Point3,_float>.z;
  auVar4._0_8_ = PVar15.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar4._8_56_ = auVar14;
  local_68 = vmovlpd_avx(auVar4._0_16_);
  t1 = &local_4c;
  local_58 = local_68;
  local_50 = local_60;
  pstd::span<const_pbrt::Point3<float>_>::operator[](local_20,(size_t)t);
  pstd::span<const_pbrt::Point3<float>_>::operator[](local_20,2);
  auVar14 = (undefined1  [56])0x0;
  PVar15 = Lerp<pbrt::Point3,float>(in_stack_fffffffffffffea4,in_stack_fffffffffffffe98,t1);
  local_78.z = PVar15.super_Tuple3<pbrt::Point3,_float>.z;
  auVar5._0_8_ = PVar15.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = auVar14;
  local_78._0_8_ = vmovlpd_avx(auVar5._0_16_);
  t0 = &local_40;
  local_4c._0_8_ = local_78._0_8_;
  local_4c.z = local_78.z;
  pstd::span<const_pbrt::Point3<float>_>::operator[](local_20,2);
  pstd::span<const_pbrt::Point3<float>_>::operator[](local_20,3);
  auVar14 = (undefined1  [56])0x0;
  PVar15 = Lerp<pbrt::Point3,float>(in_stack_fffffffffffffea4,t0,t1);
  local_88.z = PVar15.super_Tuple3<pbrt::Point3,_float>.z;
  auVar6._0_8_ = PVar15.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar6._8_56_ = auVar14;
  local_88._0_8_ = vmovlpd_avx(auVar6._0_16_);
  auVar14 = (undefined1  [56])0x0;
  local_40._0_8_ = local_88._0_8_;
  local_40.z = local_88.z;
  PVar15 = Lerp<pbrt::Point3,float>(in_stack_fffffffffffffea4,t0,t1);
  local_b0 = PVar15.super_Tuple3<pbrt::Point3,_float>.z;
  auVar7._0_8_ = PVar15.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar7._8_56_ = auVar14;
  local_b8 = vmovlpd_avx(auVar7._0_16_);
  auVar14 = (undefined1  [56])0x0;
  local_a8 = local_b8;
  local_a0 = local_b0;
  PVar15 = Lerp<pbrt::Point3,float>(in_stack_fffffffffffffea4,t0,t1);
  local_c0 = PVar15.super_Tuple3<pbrt::Point3,_float>.z;
  auVar8._0_8_ = PVar15.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar8._8_56_ = auVar14;
  local_c8 = vmovlpd_avx(auVar8._0_16_);
  local_9c = local_c8;
  local_94 = local_c0;
  if (local_30 != (undefined8 *)0x0) {
    VVar16 = Point3<float>::operator-
                       (this,(Point3<float> *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffe48));
    local_d4.z = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar9._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar9._8_56_ = auVar14;
    local_d4._0_8_ = vmovlpd_avx(auVar9._0_16_);
    fVar3 = LengthSquared<float>((Vector3<float> *)&local_d4);
    if (fVar3 <= 0.0) {
      auVar14 = extraout_var;
      pstd::span<const_pbrt::Point3<float>_>::operator[](local_20,3);
      pstd::span<const_pbrt::Point3<float>_>::operator[](local_20,0);
      VVar16 = Point3<float>::operator-
                         (this,(Point3<float> *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffe48));
      auVar12._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar12._8_56_ = auVar14;
      uVar1 = vmovlpd_avx(auVar12._0_16_);
      *local_30 = uVar1;
      *(float *)(local_30 + 1) = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
    }
    else {
      auVar14 = extraout_var;
      VVar16 = Point3<float>::operator-
                         (this,(Point3<float> *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffe48));
      auVar10._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar10._8_56_ = auVar14;
      vmovlpd_avx(auVar10._0_16_);
      VVar16 = operator*(local_24,t);
      auVar11._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar11._8_56_ = auVar14;
      uVar1 = vmovlpd_avx(auVar11._0_16_);
      *local_30 = uVar1;
      *(float *)(local_30 + 1) = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
    }
  }
  auVar14 = (undefined1  [56])0x0;
  PVar15 = Lerp<pbrt::Point3,float>(in_stack_fffffffffffffea4,t0,t1);
  auVar13._0_8_ = PVar15.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar13._8_56_ = auVar14;
  uVar1 = vmovlpd_avx(auVar13._0_16_);
  TVar2.z = PVar15.super_Tuple3<pbrt::Point3,_float>.z;
  TVar2.x = (float)(int)uVar1;
  TVar2.y = (float)(int)((ulong)uVar1 >> 0x20);
  return (Point3<float>)TVar2;
}

Assistant:

PBRT_CPU_GPU inline P EvaluateCubicBezier(pstd::span<const P> cp, Float u, V *deriv) {
    P cp1[3] = {Lerp(u, cp[0], cp[1]), Lerp(u, cp[1], cp[2]), Lerp(u, cp[2], cp[3])};
    P cp2[2] = {Lerp(u, cp1[0], cp1[1]), Lerp(u, cp1[1], cp1[2])};
    if (deriv != nullptr) {
        if (LengthSquared(cp2[1] - cp2[0]) > 0)
            *deriv = 3 * (cp2[1] - cp2[0]);
        else {
            // For a cubic Bezier, if the first three control points (say) are
            // coincident, then the derivative of the curve is legitimately
            // (0,0,0) at u=0.  This is problematic for us, though, since we'd
            // like to be able to compute a surface normal there.  In that case,
            // just punt and take the difference between the first and last
            // control points, which ain't great, but will hopefully do.
            *deriv = cp[3] - cp[0];
        }
    }
    return Lerp(u, cp2[0], cp2[1]);
}